

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetOtherScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan,
              int *pNbMeasurements)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double local_140;
  double local_138;
  double theta;
  unsigned_short distance;
  double theta2;
  double theta1;
  double dtheta2;
  double dtheta1;
  char dtheta2_q3;
  char dtheta1_q3;
  unsigned_short distance2;
  unsigned_short distance1;
  unsigned_short start_angle_q6_prev;
  unsigned_short start_angle_q6;
  uchar databuf [132];
  int local_3c;
  int j;
  int *pNbMeasurements_local;
  BOOL *pbNewScan_local;
  double *pAngles_local;
  double *pDistances_local;
  RPLIDAR *pRPLIDAR_local;
  
  databuf[0x68] = '\0';
  databuf[0x69] = '\0';
  databuf[0x6a] = '\0';
  databuf[0x6b] = '\0';
  databuf[0x6c] = '\0';
  databuf[0x6d] = '\0';
  databuf[0x6e] = '\0';
  databuf[0x6f] = '\0';
  databuf[0x70] = '\0';
  databuf[0x71] = '\0';
  databuf[0x72] = '\0';
  databuf[0x73] = '\0';
  databuf[0x74] = '\0';
  databuf[0x75] = '\0';
  databuf[0x76] = '\0';
  databuf[0x77] = '\0';
  databuf[0x58] = '\0';
  databuf[0x59] = '\0';
  databuf[0x5a] = '\0';
  databuf[0x5b] = '\0';
  databuf[0x5c] = '\0';
  databuf[0x5d] = '\0';
  databuf[0x5e] = '\0';
  databuf[0x5f] = '\0';
  databuf[0x60] = '\0';
  databuf[0x61] = '\0';
  databuf[0x62] = '\0';
  databuf[99] = '\0';
  databuf[100] = '\0';
  databuf[0x65] = '\0';
  databuf[0x66] = '\0';
  databuf[0x67] = '\0';
  databuf[0x48] = '\0';
  databuf[0x49] = '\0';
  databuf[0x4a] = '\0';
  databuf[0x4b] = '\0';
  databuf[0x4c] = '\0';
  databuf[0x4d] = '\0';
  databuf[0x4e] = '\0';
  databuf[0x4f] = '\0';
  databuf[0x50] = '\0';
  databuf[0x51] = '\0';
  databuf[0x52] = '\0';
  databuf[0x53] = '\0';
  databuf[0x54] = '\0';
  databuf[0x55] = '\0';
  databuf[0x56] = '\0';
  databuf[0x57] = '\0';
  databuf[0x38] = '\0';
  databuf[0x39] = '\0';
  databuf[0x3a] = '\0';
  databuf[0x3b] = '\0';
  databuf[0x3c] = '\0';
  databuf[0x3d] = '\0';
  databuf[0x3e] = '\0';
  databuf[0x3f] = '\0';
  databuf[0x40] = '\0';
  databuf[0x41] = '\0';
  databuf[0x42] = '\0';
  databuf[0x43] = '\0';
  databuf[0x44] = '\0';
  databuf[0x45] = '\0';
  databuf[0x46] = '\0';
  databuf[0x47] = '\0';
  databuf[0x28] = '\0';
  databuf[0x29] = '\0';
  databuf[0x2a] = '\0';
  databuf[0x2b] = '\0';
  databuf[0x2c] = '\0';
  databuf[0x2d] = '\0';
  databuf[0x2e] = '\0';
  databuf[0x2f] = '\0';
  databuf[0x30] = '\0';
  databuf[0x31] = '\0';
  databuf[0x32] = '\0';
  databuf[0x33] = '\0';
  databuf[0x34] = '\0';
  databuf[0x35] = '\0';
  databuf[0x36] = '\0';
  databuf[0x37] = '\0';
  databuf[0x18] = '\0';
  databuf[0x19] = '\0';
  databuf[0x1a] = '\0';
  databuf[0x1b] = '\0';
  databuf[0x1c] = '\0';
  databuf[0x1d] = '\0';
  databuf[0x1e] = '\0';
  databuf[0x1f] = '\0';
  databuf[0x20] = '\0';
  databuf[0x21] = '\0';
  databuf[0x22] = '\0';
  databuf[0x23] = '\0';
  databuf[0x24] = '\0';
  databuf[0x25] = '\0';
  databuf[0x26] = '\0';
  databuf[0x27] = '\0';
  databuf[8] = '\0';
  databuf[9] = '\0';
  databuf[10] = '\0';
  databuf[0xb] = '\0';
  databuf[0xc] = '\0';
  databuf[0xd] = '\0';
  databuf[0xe] = '\0';
  databuf[0xf] = '\0';
  databuf[0x10] = '\0';
  databuf[0x11] = '\0';
  databuf[0x12] = '\0';
  databuf[0x13] = '\0';
  databuf[0x14] = '\0';
  databuf[0x15] = '\0';
  databuf[0x16] = '\0';
  databuf[0x17] = '\0';
  _distance2 = 0;
  databuf[0] = '\0';
  databuf[1] = '\0';
  databuf[2] = '\0';
  databuf[3] = '\0';
  databuf[4] = '\0';
  databuf[5] = '\0';
  databuf[6] = '\0';
  databuf[7] = '\0';
  databuf[0x78] = '\0';
  databuf[0x79] = '\0';
  databuf[0x7a] = '\0';
  databuf[0x7b] = '\0';
  iVar11 = pRPLIDAR->esversion;
  if (iVar11 == 0x82) {
    iVar11 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,(uchar *)&distance2,0x54);
    if (iVar11 != 0) {
      return 1;
    }
  }
  else if (iVar11 == 0x84) {
    iVar11 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,(uchar *)&distance2,0x84);
    if (iVar11 != 0) {
      return 1;
    }
  }
  else {
    if (iVar11 != 0x85) {
      printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
      return 1;
    }
    iVar11 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,(uchar *)&distance2,0x54);
    if (iVar11 != 0) {
      return 1;
    }
  }
  uVar9 = (distance1._1_1_ & 0x7f) << 8 | (ushort)(byte)distance1;
  iVar11 = pRPLIDAR->esversion;
  if (iVar11 == 0x82) {
    uVar10 = (pRPLIDAR->esdata_prev[3] & 0x7f) << 8 | (ushort)pRPLIDAR->esdata_prev[2];
    *pbNewScan = (int)(uint)pRPLIDAR->esdata_prev[3] >> 7;
    *pNbMeasurements = 0x20;
    for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
      uVar3 = pRPLIDAR->esdata_prev[local_3c * 5 + 5];
      uVar4 = pRPLIDAR->esdata_prev[local_3c * 5 + 4];
      uVar1 = pRPLIDAR->esdata_prev[local_3c * 5 + 7];
      uVar2 = pRPLIDAR->esdata_prev[local_3c * 5 + 2];
      bVar5 = (pRPLIDAR->esdata_prev[local_3c * 5 + 4] & 3) << 4;
      bVar6 = bVar5 | pRPLIDAR->esdata_prev[local_3c * 5 + 8] & 0xf;
      bVar7 = (pRPLIDAR->esdata_prev[local_3c * 5 + 6] & 3) << 4;
      bVar8 = bVar7 | (byte)((int)(uint)pRPLIDAR->esdata_prev[local_3c * 5 + 8] >> 4);
      if ((char)(bVar5 & 0x20) >> 5 == '\0') {
        uVar12 = (int)(char)bVar6 & 0x1f;
      }
      else {
        uVar12 = -((int)(char)bVar6 & 0x1fU ^ 0xffffffff);
      }
      local_138 = (double)(int)uVar12 / 8.0;
      if ((char)(bVar7 & 0x20) >> 5 == '\0') {
        uVar12 = (int)(char)bVar8 & 0x1f;
      }
      else {
        uVar12 = -((int)(char)bVar8 & 0x1fU ^ 0xffffffff);
      }
      local_140 = (double)(int)uVar12 / 8.0;
      dVar14 = AngleDiffRPLIDAR((double)uVar10 / 64.0,(double)uVar9 / 64.0);
      dVar13 = AngleDiffRPLIDAR((double)uVar10 / 64.0,(double)uVar9 / 64.0);
      dVar14 = fmod_2PI_deg2rad(-(((double)uVar10 / 64.0 +
                                  (dVar14 * (double)(local_3c * 2 + 1)) / 32.0) - local_138));
      pAngles[local_3c << 1] = dVar14;
      dVar14 = fmod_2PI_deg2rad(-(((double)uVar10 / 64.0 +
                                  (dVar13 * (double)(local_3c * 2 + 2)) / 32.0) - local_140));
      pAngles[local_3c * 2 + 1] = dVar14;
      pDistances[local_3c << 1] = (double)((int)(uint)CONCAT11(uVar3,uVar4) >> 2) / 1000.0;
      pDistances[local_3c * 2 + 1] = (double)((int)(uint)CONCAT11(uVar1,uVar2) >> 2) / 1000.0;
    }
    memcpy(pRPLIDAR->esdata_prev,&distance2,0x54);
  }
  else {
    if (iVar11 == 0x84) {
      printf(
            "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n"
            );
      return 0x11;
    }
    if (iVar11 != 0x85) {
      printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
      return 1;
    }
    uVar10 = (pRPLIDAR->desdata_prev[3] & 0x7f) << 8 | (ushort)pRPLIDAR->desdata_prev[2];
    *pbNewScan = (int)(uint)pRPLIDAR->desdata_prev[3] >> 7;
    *pNbMeasurements = 0x28;
    for (local_3c = 0; local_3c < 0x28; local_3c = local_3c + 1) {
      uVar3 = pRPLIDAR->desdata_prev[local_3c * 2 + 5];
      uVar4 = pRPLIDAR->desdata_prev[local_3c * 2 + 4];
      dVar14 = AngleDiffRPLIDAR((double)uVar10 / 64.0,(double)uVar9 / 64.0);
      dVar14 = fmod_2PI_deg2rad(-((double)uVar10 / 64.0 + (dVar14 * (double)local_3c) / 40.0));
      pAngles[local_3c] = dVar14;
      pDistances[local_3c] = (double)CONCAT11(uVar3,uVar4) / 1000.0;
    }
    memcpy(pRPLIDAR->desdata_prev,&distance2,0x54);
  }
  return 0;
}

Assistant:

inline int GetOtherScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan, int* pNbMeasurements)
{
	int j = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	CHRONO chrono;

	*pNbMeasurements = NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR;

	StartChrono(&chrono);

	while ((int)nodesRead < *pNbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = *pNbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}

	*pNbMeasurements = (int)nodesRead;

	// Analyze the data response.
	*pbNewScan = 0;

	//memset(pAngles, 0, nodesRead*sizeof(double));
	//memset(pDistances, 0, nodesRead*sizeof(double));
	for (j = 0; j < (int)nodesRead; j++)
	{
		*pbNewScan = (*pbNewScan) | (nodes[j].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);

		// Convert in rad.
		pAngles[j] = fmod_2PI_deg2rad(-nodes[j].angle_z_q14*90.0/(1 << 14));

		// Convert in m.
		pDistances[j] = nodes[j].dist_mm_q2/4000.0;
	}
#else
	unsigned char databuf[max(max(NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR), NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)];
	unsigned short start_angle_q6 = 0;
	unsigned short start_angle_q6_prev = 0;

	unsigned short distance1 = 0; // Legacy.
	unsigned short distance2 = 0; // Legacy.
	char dtheta1_q3 = 0; // Legacy.
	char dtheta2_q3 = 0; // Legacy.
	double dtheta1 = 0; // Legacy.
	double dtheta2 = 0; // Legacy.
	double theta1 = 0; // Legacy.
	double theta2 = 0; // Legacy.

	//unsigned int major = 0, predict1 = 0, predict2 = 0; // Extended.

	unsigned short distance = 0; // Dense.
	double theta = 0; // Dense.

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}

	start_angle_q6 = ((databuf[3] & 0x7F)<<8) | databuf[2];

	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		// Analyze the previous data response.
		start_angle_q6_prev = ((pRPLIDAR->esdata_prev[3] & 0x7F)<<8) | pRPLIDAR->esdata_prev[2];
		*pbNewScan = pRPLIDAR->esdata_prev[3]>>7;

		*pNbMeasurements = NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//memset(pAngles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//memset(pDistances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		for (j = 0; j < NB_CABINS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		{
			distance1 = ((pRPLIDAR->esdata_prev[4+5*j+1]<<8)|pRPLIDAR->esdata_prev[4+5*j+0])>>2;
			distance2 = ((pRPLIDAR->esdata_prev[4+5*j+3]<<8)|pRPLIDAR->esdata_prev[5*j+2])>>2;
			dtheta1_q3 = ((pRPLIDAR->esdata_prev[4+5*j+0] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4] & 0x0F);
			dtheta2_q3 = ((pRPLIDAR->esdata_prev[4+5*j+2] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4]>>4);
			// Handle the sign bit...
			dtheta1 = ((dtheta1_q3 & 0x20)>>5)? (-~(dtheta1_q3 & 0x1F))/8.0: (dtheta1_q3 & 0x1F)/8.0;
			dtheta2 = ((dtheta2_q3 & 0x20)>>5)? (-~(dtheta2_q3 & 0x1F))/8.0: (dtheta2_q3 & 0x1F)/8.0;

			// k indexes in the formula of the documentation start at 1...
			theta1 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+1)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta1;
			theta2 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+2)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta2;

			// Convert in rad.
			pAngles[2*j+0] = fmod_2PI_deg2rad(-theta1);
			pAngles[2*j+1] = fmod_2PI_deg2rad(-theta2);

			// Convert in m.
			pDistances[2*j+0] = distance1/1000.0;
			pDistances[2*j+1] = distance2/1000.0;
		}
		memcpy(pRPLIDAR->esdata_prev, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n");
		return EXIT_NOT_IMPLEMENTED;

		// Need to check SDK code...  		 

		//// Analyze the previous data response.
		//start_angle_q6_prev = ((pRPLIDAR->eesdata_prev[3] & 0x7F)<<8) | pRPLIDAR->eesdata_prev[2];
		//*pbNewScan = pRPLIDAR->eesdata_prev[3]>>7;

		//*pNbMeasurements = NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		////memset(pAngles, 0, NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		////memset(pDistances, 0, NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//for (j = 0; j < NB_CABINS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		//{
		//	major = ((pRPLIDAR->eesdata_prev[4+4*j+1] & 0x0F)<<8)|(pRPLIDAR->eesdata_prev[4+4*j+0]);
		//	predict1 = ((pRPLIDAR->eesdata_prev[4+4*j+2] & 0x03)<<6)|((pRPLIDAR->eesdata_prev[4+4*j+1] & 0xF0)>>4);
		//	predict2 = ((pRPLIDAR->eesdata_prev[4+4*j+3] & 0xFF)<<2)|((pRPLIDAR->eesdata_prev[4+4*j+2] & 0xC0)>>6);

		//	// k indexes in the formula of the documentation start at 1...
		//	theta = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*j/NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//	// Convert in rad.
		//	pAngles[j] = fmod_2PI_deg2rad(-theta);

		//	// Convert in m.
		//	pDistances[j] = distance/1000.0;
		//}
		//memcpy(pRPLIDAR->eesdata_prev, databuf, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		// Analyze the previous data response.
		start_angle_q6_prev = ((pRPLIDAR->desdata_prev[3] & 0x7F)<<8) | pRPLIDAR->desdata_prev[2];
		*pbNewScan = pRPLIDAR->desdata_prev[3]>>7;

		*pNbMeasurements = NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//memset(pAngles, 0, NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//memset(pDistances, 0, NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		for (j = 0; j < NB_CABINS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		{
			distance = ((pRPLIDAR->desdata_prev[4+2*j+1]<<8)|pRPLIDAR->desdata_prev[4+2*j+0]);

			// k indexes in the formula of the documentation start at 1...
			theta = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*j/NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

			// Convert in rad.
			pAngles[j] = fmod_2PI_deg2rad(-theta);

			// Convert in m.
			pDistances[j] = distance/1000.0;
		}
		memcpy(pRPLIDAR->desdata_prev, databuf, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}